

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderStairs<ImPlot::GetterYs<unsigned_short>,ImPlot::TransformerLinLog>
               (GetterYs<unsigned_short> *getter,TransformerLinLog *transformer,ImDrawList *DrawList
               ,float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ImPlotPlot *pIVar5;
  float fVar6;
  ImPlotContext *pIVar7;
  ImPlotContext *pIVar8;
  ImDrawList *this;
  int iVar9;
  int iVar10;
  ImPlotContext *gp;
  float fVar11;
  double dVar12;
  ImVec2 p2;
  ImVec2 p12;
  ImVec2 p1;
  ImVec2 local_70;
  ImVec2 local_68;
  ImDrawList *local_60;
  undefined1 local_58 [8];
  TransformerLinLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar7 = GImPlot;
  pIVar5 = GImPlot->CurrentPlot;
  local_60 = DrawList;
  if (((pIVar5->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar9 = getter->Count;
    local_48 = iVar9 + -1;
    local_40 = line_weight * 0.5;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    dVar2 = getter->XScale;
    dVar3 = getter->X0;
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    dVar12 = log10((double)*(ushort *)
                            ((long)getter->Ys +
                            (long)((getter->Offset % iVar9 + iVar9) % iVar9) * (long)getter->Stride)
                   / pIVar5->YAxis[transformer->YAxis].Range.Min);
    iVar9 = transformer->YAxis;
    pIVar5 = pIVar7->CurrentPlot;
    dVar4 = pIVar5->YAxis[iVar9].Range.Min;
    local_3c.x = (float)(((dVar2 * 0.0 + dVar3) - (pIVar5->XAxis).Range.Min) * pIVar7->Mx +
                        (double)pIVar7->PixelRange[iVar9].Min.x);
    local_3c.y = (float)((((double)(float)(dVar12 / pIVar7->LogDenY[iVar9]) *
                           (pIVar5->YAxis[iVar9].Range.Max - dVar4) + dVar4) - dVar4) *
                         pIVar7->My[iVar9] + (double)pIVar7->PixelRange[iVar9].Min.y);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterYs<unsigned_short>,ImPlot::TransformerLinLog>>
              ((StairsRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::TransformerLinLog> *)
               local_58,local_60,&pIVar5->PlotRect);
  }
  else {
    dVar2 = getter->XScale;
    dVar3 = getter->X0;
    iVar9 = getter->Count;
    dVar12 = log10((double)*(ushort *)
                            ((long)getter->Ys +
                            (long)((getter->Offset % iVar9 + iVar9) % iVar9) * (long)getter->Stride)
                   / pIVar5->YAxis[transformer->YAxis].Range.Min);
    iVar9 = transformer->YAxis;
    pIVar5 = pIVar7->CurrentPlot;
    dVar4 = pIVar5->YAxis[iVar9].Range.Min;
    local_58._0_4_ =
         (undefined4)
         (((dVar2 * 0.0 + dVar3) - (pIVar5->XAxis).Range.Min) * pIVar7->Mx +
         (double)pIVar7->PixelRange[iVar9].Min.x);
    local_58._4_4_ =
         (float)((((double)(float)(dVar12 / pIVar7->LogDenY[iVar9]) *
                   (pIVar5->YAxis[iVar9].Range.Max - dVar4) + dVar4) - dVar4) * pIVar7->My[iVar9] +
                (double)pIVar7->PixelRange[iVar9].Min.y);
    iVar9 = getter->Count;
    if (1 < iVar9) {
      iVar10 = 1;
      do {
        pIVar8 = GImPlot;
        dVar2 = getter->XScale;
        dVar3 = getter->X0;
        dVar12 = log10((double)*(ushort *)
                                ((long)getter->Ys +
                                (long)(((getter->Offset + iVar10) % iVar9 + iVar9) % iVar9) *
                                (long)getter->Stride) /
                       GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        this = local_60;
        iVar9 = transformer->YAxis;
        pIVar5 = pIVar8->CurrentPlot;
        dVar4 = pIVar5->YAxis[iVar9].Range.Min;
        local_70.x = (float)((((double)iVar10 * dVar2 + dVar3) - (pIVar5->XAxis).Range.Min) *
                             pIVar8->Mx + (double)pIVar8->PixelRange[iVar9].Min.x);
        fVar11 = (float)((((double)(float)(dVar12 / pIVar8->LogDenY[iVar9]) *
                           (pIVar5->YAxis[iVar9].Range.Max - dVar4) + dVar4) - dVar4) *
                         pIVar8->My[iVar9] + (double)pIVar8->PixelRange[iVar9].Min.y);
        local_70.y = fVar11;
        pIVar5 = pIVar7->CurrentPlot;
        fVar6 = (float)local_58._4_4_;
        if (fVar11 <= (float)local_58._4_4_) {
          fVar6 = fVar11;
        }
        if ((fVar6 < (pIVar5->PlotRect).Max.y) &&
           (fVar6 = (float)(~-(uint)(fVar11 <= (float)local_58._4_4_) & (uint)fVar11 |
                           -(uint)(fVar11 <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar5->PlotRect).Min.y, *pfVar1 <= fVar6 && fVar6 != *pfVar1)) {
          fVar6 = (float)local_58._0_4_;
          if (local_70.x <= (float)local_58._0_4_) {
            fVar6 = local_70.x;
          }
          if ((fVar6 < (pIVar5->PlotRect).Max.x) &&
             (fVar6 = (float)(~-(uint)(local_70.x <= (float)local_58._0_4_) & (uint)local_70.x |
                             local_58._0_4_ & -(uint)(local_70.x <= (float)local_58._0_4_)),
             (pIVar5->PlotRect).Min.x <= fVar6 && fVar6 != (pIVar5->PlotRect).Min.x)) {
            local_68.y = (float)local_58._4_4_;
            local_68.x = local_70.x;
            ImDrawList::AddLine(local_60,(ImVec2 *)local_58,&local_68,col,line_weight);
            ImDrawList::AddLine(this,&local_68,&local_70,col,line_weight);
          }
        }
        local_58._0_4_ = local_70.x;
        local_58._4_4_ = local_70.y;
        iVar10 = iVar10 + 1;
        iVar9 = getter->Count;
      } while (iVar10 < iVar9);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}